

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void iadst16_low1_ssse3(__m128i *input,__m128i *output)

{
  __m128i __rounding_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined2 uVar35;
  short sVar36;
  uint uVar37;
  int iVar38;
  uint uVar39;
  int iVar40;
  int32_t *piVar41;
  __m128i *in_RSI;
  undefined1 (*in_RDI) [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  __m128i d1_2;
  __m128i d0_2;
  __m128i c1_2;
  __m128i c0_2;
  __m128i b1_2;
  __m128i b0_2;
  __m128i a1_2;
  __m128i a0_2;
  __m128i v1_2;
  __m128i v0_2;
  __m128i u1_2;
  __m128i u0_2;
  __m128i t1_2;
  __m128i t0_2;
  __m128i d1_1;
  __m128i d0_1;
  __m128i c1_1;
  __m128i c0_1;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a1_1;
  __m128i a0_1;
  __m128i v1_1;
  __m128i v0_1;
  __m128i u1_1;
  __m128i u0_1;
  __m128i t1_1;
  __m128i t0_1;
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i v1;
  __m128i v0;
  __m128i u1;
  __m128i u0;
  __m128i t1;
  __m128i t0;
  __m128i _in;
  __m128i _w1;
  __m128i _w0;
  __m128i x [16];
  __m128i cospi_p48_m16;
  __m128i cospi_p16_p48;
  __m128i cospi_p56_m08;
  __m128i cospi_p08_p56;
  __m128i __rounding;
  int32_t *cospi;
  int8_t cos_bit;
  __m128i local_8c8;
  undefined1 local_8b8 [16];
  longlong local_8a8;
  longlong lStackY_8a0;
  undefined8 local_898;
  undefined8 uStackY_890;
  undefined7 local_888;
  undefined2 local_6e8;
  undefined2 uStack_6e6;
  undefined2 uStack_6e4;
  undefined2 uStack_6e2;
  undefined2 local_6d8;
  undefined2 uStack_6d6;
  undefined2 uStack_6d4;
  undefined2 uStack_6d2;
  undefined2 local_6a8;
  undefined2 uStack_6a6;
  undefined2 uStack_6a4;
  undefined2 uStack_6a2;
  undefined2 local_698;
  undefined2 uStack_696;
  undefined2 uStack_694;
  undefined2 uStack_692;
  undefined2 uStack_680;
  undefined2 uStack_67e;
  undefined2 uStack_67c;
  undefined2 uStack_67a;
  undefined2 uStack_670;
  undefined2 uStack_66e;
  undefined2 uStack_66c;
  undefined2 uStack_66a;
  undefined2 uStack_640;
  undefined2 uStack_63e;
  undefined2 uStack_63c;
  undefined2 uStack_63a;
  undefined2 uStack_630;
  undefined2 uStack_62e;
  undefined2 uStack_62c;
  undefined2 uStack_62a;
  int local_498;
  int iStack_494;
  int iStack_490;
  int iStack_48c;
  int local_478;
  int iStack_474;
  int iStack_470;
  int iStack_46c;
  int local_458;
  int iStack_454;
  int iStack_450;
  int iStack_44c;
  int local_438;
  int iStack_434;
  int iStack_430;
  int iStack_42c;
  int local_418;
  int iStack_414;
  int iStack_410;
  int iStack_40c;
  int local_3f8;
  int iStack_3f4;
  int iStack_3f0;
  int iStack_3ec;
  int local_3d8;
  int iStack_3d4;
  int iStack_3d0;
  int iStack_3cc;
  int local_3b8;
  int iStack_3b4;
  int iStack_3b0;
  int iStack_3ac;
  int local_398;
  int iStack_394;
  int iStack_390;
  int iStack_38c;
  int local_378;
  int iStack_374;
  int iStack_370;
  int iStack_36c;
  int local_358;
  int iStack_354;
  int iStack_350;
  int iStack_34c;
  int local_338;
  int iStack_334;
  int iStack_330;
  int iStack_32c;
  
  piVar41 = cospi_arr(0xc);
  uVar37 = (uint)*(ushort *)(piVar41 + 8) | piVar41[0x38] << 0x10;
  iVar38 = (uint)*(ushort *)(piVar41 + 0x38) + piVar41[8] * -0x10000;
  uVar39 = (uint)*(ushort *)(piVar41 + 0x10) | piVar41[0x30] << 0x10;
  uVar31 = CONCAT44(uVar39,uVar39);
  uVar32 = CONCAT44(uVar39,uVar39);
  iVar40 = (uint)*(ushort *)(piVar41 + 0x30) + piVar41[0x10] * -0x10000;
  uVar33 = CONCAT44(iVar40,iVar40);
  uVar34 = CONCAT44(iVar40,iVar40);
  uVar35 = (undefined2)(piVar41[0x3e] << 3);
  auVar43._2_2_ = uVar35;
  auVar43._0_2_ = uVar35;
  auVar43._4_2_ = uVar35;
  auVar43._6_2_ = uVar35;
  auVar43._10_2_ = uVar35;
  auVar43._8_2_ = uVar35;
  auVar43._12_2_ = uVar35;
  auVar43._14_2_ = uVar35;
  sVar36 = (short)piVar41[2] * -8;
  auVar42._2_2_ = sVar36;
  auVar42._0_2_ = sVar36;
  auVar42._4_2_ = sVar36;
  auVar42._6_2_ = sVar36;
  auVar42._10_2_ = sVar36;
  auVar42._8_2_ = sVar36;
  auVar42._12_2_ = sVar36;
  auVar42._14_2_ = sVar36;
  local_8c8 = (__m128i)pmulhrsw(*in_RDI,auVar43);
  local_8b8 = pmulhrsw(*in_RDI,auVar42);
  local_698 = (undefined2)local_8c8[0];
  uStack_696 = local_8c8[0]._2_2_;
  uStack_694 = local_8c8[0]._4_2_;
  uStack_692 = local_8c8[0]._6_2_;
  local_6a8 = local_8b8._0_2_;
  uStack_6a6 = local_8b8._2_2_;
  uStack_6a4 = local_8b8._4_2_;
  uStack_6a2 = local_8b8._6_2_;
  uStack_630 = (undefined2)local_8c8[1];
  uStack_62e = local_8c8[1]._2_2_;
  uStack_62c = local_8c8[1]._4_2_;
  uStack_62a = local_8c8[1]._6_2_;
  uStack_640 = local_8b8._8_2_;
  uStack_63e = local_8b8._10_2_;
  uStack_63c = local_8b8._12_2_;
  uStack_63a = local_8b8._14_2_;
  auVar18._2_2_ = local_6a8;
  auVar18._0_2_ = local_698;
  auVar18._4_2_ = uStack_696;
  auVar18._6_2_ = uStack_6a6;
  auVar18._10_2_ = uStack_6a4;
  auVar18._8_2_ = uStack_694;
  auVar18._12_2_ = uStack_692;
  auVar18._14_2_ = uStack_6a2;
  auVar17._8_8_ = CONCAT44(uVar37,uVar37);
  auVar17._0_8_ = CONCAT44(uVar37,uVar37);
  auVar42 = pmaddwd(auVar18,auVar17);
  auVar16._2_2_ = uStack_640;
  auVar16._0_2_ = uStack_630;
  auVar16._4_2_ = uStack_62e;
  auVar16._6_2_ = uStack_63e;
  auVar16._10_2_ = uStack_63c;
  auVar16._8_2_ = uStack_62c;
  auVar16._12_2_ = uStack_62a;
  auVar16._14_2_ = uStack_63a;
  auVar15._8_8_ = CONCAT44(uVar37,uVar37);
  auVar15._0_8_ = CONCAT44(uVar37,uVar37);
  auVar43 = pmaddwd(auVar16,auVar15);
  auVar14._2_2_ = local_6a8;
  auVar14._0_2_ = local_698;
  auVar14._4_2_ = uStack_696;
  auVar14._6_2_ = uStack_6a6;
  auVar14._10_2_ = uStack_6a4;
  auVar14._8_2_ = uStack_694;
  auVar14._12_2_ = uStack_692;
  auVar14._14_2_ = uStack_6a2;
  auVar13._8_8_ = CONCAT44(iVar38,iVar38);
  auVar13._0_8_ = CONCAT44(iVar38,iVar38);
  auVar44 = pmaddwd(auVar14,auVar13);
  auVar12._2_2_ = uStack_640;
  auVar12._0_2_ = uStack_630;
  auVar12._4_2_ = uStack_62e;
  auVar12._6_2_ = uStack_63e;
  auVar12._10_2_ = uStack_63c;
  auVar12._8_2_ = uStack_62c;
  auVar12._12_2_ = uStack_62a;
  auVar12._14_2_ = uStack_63a;
  auVar11._8_8_ = CONCAT44(iVar38,iVar38);
  auVar11._0_8_ = CONCAT44(iVar38,iVar38);
  auVar45 = pmaddwd(auVar12,auVar11);
  local_338 = auVar42._0_4_;
  iStack_334 = auVar42._4_4_;
  iStack_330 = auVar42._8_4_;
  iStack_32c = auVar42._12_4_;
  local_358 = auVar43._0_4_;
  iStack_354 = auVar43._4_4_;
  iStack_350 = auVar43._8_4_;
  iStack_34c = auVar43._12_4_;
  local_378 = auVar44._0_4_;
  iStack_374 = auVar44._4_4_;
  iStack_370 = auVar44._8_4_;
  iStack_36c = auVar44._12_4_;
  local_398 = auVar45._0_4_;
  iStack_394 = auVar45._4_4_;
  iStack_390 = auVar45._8_4_;
  iStack_38c = auVar45._12_4_;
  auVar42 = ZEXT416(0xc);
  auVar43 = ZEXT416(0xc);
  auVar44 = ZEXT416(0xc);
  auVar45 = ZEXT416(0xc);
  auVar30._4_4_ = iStack_334 + 0x800 >> auVar42;
  auVar30._0_4_ = local_338 + 0x800 >> auVar42;
  auVar30._12_4_ = iStack_32c + 0x800 >> auVar42;
  auVar30._8_4_ = iStack_330 + 0x800 >> auVar42;
  auVar29._4_4_ = iStack_354 + 0x800 >> auVar43;
  auVar29._0_4_ = local_358 + 0x800 >> auVar43;
  auVar29._12_4_ = iStack_34c + 0x800 >> auVar43;
  auVar29._8_4_ = iStack_350 + 0x800 >> auVar43;
  auVar42 = packssdw(auVar30,auVar29);
  auVar28._4_4_ = iStack_374 + 0x800 >> auVar44;
  auVar28._0_4_ = local_378 + 0x800 >> auVar44;
  auVar28._12_4_ = iStack_36c + 0x800 >> auVar44;
  auVar28._8_4_ = iStack_370 + 0x800 >> auVar44;
  auVar27._4_4_ = iStack_394 + 0x800 >> auVar45;
  auVar27._0_4_ = local_398 + 0x800 >> auVar45;
  auVar27._12_4_ = iStack_38c + 0x800 >> auVar45;
  auVar27._8_4_ = iStack_390 + 0x800 >> auVar45;
  auVar43 = packssdw(auVar28,auVar27);
  auVar10._2_2_ = local_6a8;
  auVar10._0_2_ = local_698;
  auVar10._4_2_ = uStack_696;
  auVar10._6_2_ = uStack_6a6;
  auVar10._10_2_ = uStack_6a4;
  auVar10._8_2_ = uStack_694;
  auVar10._12_2_ = uStack_692;
  auVar10._14_2_ = uStack_6a2;
  auVar9._8_8_ = uVar32;
  auVar9._0_8_ = uVar31;
  auVar44 = pmaddwd(auVar10,auVar9);
  auVar8._2_2_ = uStack_640;
  auVar8._0_2_ = uStack_630;
  auVar8._4_2_ = uStack_62e;
  auVar8._6_2_ = uStack_63e;
  auVar8._10_2_ = uStack_63c;
  auVar8._8_2_ = uStack_62c;
  auVar8._12_2_ = uStack_62a;
  auVar8._14_2_ = uStack_63a;
  auVar7._8_8_ = uVar32;
  auVar7._0_8_ = uVar31;
  auVar45 = pmaddwd(auVar8,auVar7);
  auVar6._2_2_ = local_6a8;
  auVar6._0_2_ = local_698;
  auVar6._4_2_ = uStack_696;
  auVar6._6_2_ = uStack_6a6;
  auVar6._10_2_ = uStack_6a4;
  auVar6._8_2_ = uStack_694;
  auVar6._12_2_ = uStack_692;
  auVar6._14_2_ = uStack_6a2;
  auVar5._8_8_ = uVar34;
  auVar5._0_8_ = uVar33;
  auVar46 = pmaddwd(auVar6,auVar5);
  auVar49._2_2_ = uStack_640;
  auVar49._0_2_ = uStack_630;
  auVar49._4_2_ = uStack_62e;
  auVar49._6_2_ = uStack_63e;
  auVar49._10_2_ = uStack_63c;
  auVar49._8_2_ = uStack_62c;
  auVar49._12_2_ = uStack_62a;
  auVar49._14_2_ = uStack_63a;
  auVar48._8_8_ = uVar34;
  auVar48._0_8_ = uVar33;
  auVar47 = pmaddwd(auVar49,auVar48);
  local_3b8 = auVar44._0_4_;
  iStack_3b4 = auVar44._4_4_;
  iStack_3b0 = auVar44._8_4_;
  iStack_3ac = auVar44._12_4_;
  local_3d8 = auVar45._0_4_;
  iStack_3d4 = auVar45._4_4_;
  iStack_3d0 = auVar45._8_4_;
  iStack_3cc = auVar45._12_4_;
  local_3f8 = auVar46._0_4_;
  iStack_3f4 = auVar46._4_4_;
  iStack_3f0 = auVar46._8_4_;
  iStack_3ec = auVar46._12_4_;
  local_418 = auVar47._0_4_;
  iStack_414 = auVar47._4_4_;
  iStack_410 = auVar47._8_4_;
  iStack_40c = auVar47._12_4_;
  auVar44 = ZEXT416(0xc);
  auVar45 = ZEXT416(0xc);
  auVar46 = ZEXT416(0xc);
  auVar47 = ZEXT416(0xc);
  auVar26._4_4_ = iStack_3b4 + 0x800 >> auVar44;
  auVar26._0_4_ = local_3b8 + 0x800 >> auVar44;
  auVar26._12_4_ = iStack_3ac + 0x800 >> auVar44;
  auVar26._8_4_ = iStack_3b0 + 0x800 >> auVar44;
  auVar25._4_4_ = iStack_3d4 + 0x800 >> auVar45;
  auVar25._0_4_ = local_3d8 + 0x800 >> auVar45;
  auVar25._12_4_ = iStack_3cc + 0x800 >> auVar45;
  auVar25._8_4_ = iStack_3d0 + 0x800 >> auVar45;
  auVar48 = packssdw(auVar26,auVar25);
  local_888 = auVar48._0_7_;
  auVar24._4_4_ = iStack_3f4 + 0x800 >> auVar46;
  auVar24._0_4_ = local_3f8 + 0x800 >> auVar46;
  auVar24._12_4_ = iStack_3ec + 0x800 >> auVar46;
  auVar24._8_4_ = iStack_3f0 + 0x800 >> auVar46;
  auVar23._4_4_ = iStack_414 + 0x800 >> auVar47;
  auVar23._0_4_ = local_418 + 0x800 >> auVar47;
  auVar23._12_4_ = iStack_40c + 0x800 >> auVar47;
  auVar23._8_4_ = iStack_410 + 0x800 >> auVar47;
  auVar49 = packssdw(auVar24,auVar23);
  local_6d8 = auVar42._0_2_;
  uStack_6d6 = auVar42._2_2_;
  uStack_6d4 = auVar42._4_2_;
  uStack_6d2 = auVar42._6_2_;
  local_6e8 = auVar43._0_2_;
  uStack_6e6 = auVar43._2_2_;
  uStack_6e4 = auVar43._4_2_;
  uStack_6e2 = auVar43._6_2_;
  uStack_670 = auVar42._8_2_;
  uStack_66e = auVar42._10_2_;
  uStack_66c = auVar42._12_2_;
  uStack_66a = auVar42._14_2_;
  uStack_680 = auVar43._8_2_;
  uStack_67e = auVar43._10_2_;
  uStack_67c = auVar43._12_2_;
  uStack_67a = auVar43._14_2_;
  auVar4._2_2_ = local_6e8;
  auVar4._0_2_ = local_6d8;
  auVar4._4_2_ = uStack_6d6;
  auVar4._6_2_ = uStack_6e6;
  auVar4._10_2_ = uStack_6e4;
  auVar4._8_2_ = uStack_6d4;
  auVar4._12_2_ = uStack_6d2;
  auVar4._14_2_ = uStack_6e2;
  auVar3._8_8_ = uVar32;
  auVar3._0_8_ = uVar31;
  auVar42 = pmaddwd(auVar4,auVar3);
  auVar2._2_2_ = uStack_680;
  auVar2._0_2_ = uStack_670;
  auVar2._4_2_ = uStack_66e;
  auVar2._6_2_ = uStack_67e;
  auVar2._10_2_ = uStack_67c;
  auVar2._8_2_ = uStack_66c;
  auVar2._12_2_ = uStack_66a;
  auVar2._14_2_ = uStack_67a;
  auVar1._8_8_ = uVar32;
  auVar1._0_8_ = uVar31;
  auVar43 = pmaddwd(auVar2,auVar1);
  auVar47._2_2_ = local_6e8;
  auVar47._0_2_ = local_6d8;
  auVar47._4_2_ = uStack_6d6;
  auVar47._6_2_ = uStack_6e6;
  auVar47._10_2_ = uStack_6e4;
  auVar47._8_2_ = uStack_6d4;
  auVar47._12_2_ = uStack_6d2;
  auVar47._14_2_ = uStack_6e2;
  auVar46._8_8_ = uVar34;
  auVar46._0_8_ = uVar33;
  auVar46 = pmaddwd(auVar47,auVar46);
  auVar45._2_2_ = uStack_680;
  auVar45._0_2_ = uStack_670;
  auVar45._4_2_ = uStack_66e;
  auVar45._6_2_ = uStack_67e;
  auVar45._10_2_ = uStack_67c;
  auVar45._8_2_ = uStack_66c;
  auVar45._12_2_ = uStack_66a;
  auVar45._14_2_ = uStack_67a;
  auVar44._8_8_ = uVar34;
  auVar44._0_8_ = uVar33;
  auVar44 = pmaddwd(auVar45,auVar44);
  local_438 = auVar42._0_4_;
  iStack_434 = auVar42._4_4_;
  iStack_430 = auVar42._8_4_;
  iStack_42c = auVar42._12_4_;
  local_458 = auVar43._0_4_;
  iStack_454 = auVar43._4_4_;
  iStack_450 = auVar43._8_4_;
  iStack_44c = auVar43._12_4_;
  local_478 = auVar46._0_4_;
  iStack_474 = auVar46._4_4_;
  iStack_470 = auVar46._8_4_;
  iStack_46c = auVar46._12_4_;
  local_498 = auVar44._0_4_;
  iStack_494 = auVar44._4_4_;
  iStack_490 = auVar44._8_4_;
  iStack_48c = auVar44._12_4_;
  auVar42 = ZEXT416(0xc);
  auVar43 = ZEXT416(0xc);
  auVar44 = ZEXT416(0xc);
  auVar45 = ZEXT416(0xc);
  auVar22._4_4_ = iStack_434 + 0x800 >> auVar42;
  auVar22._0_4_ = local_438 + 0x800 >> auVar42;
  auVar22._12_4_ = iStack_42c + 0x800 >> auVar42;
  auVar22._8_4_ = iStack_430 + 0x800 >> auVar42;
  auVar21._4_4_ = iStack_454 + 0x800 >> auVar43;
  auVar21._0_4_ = local_458 + 0x800 >> auVar43;
  auVar21._12_4_ = iStack_44c + 0x800 >> auVar43;
  auVar21._8_4_ = iStack_450 + 0x800 >> auVar43;
  packssdw(auVar22,auVar21);
  auVar20._4_4_ = iStack_474 + 0x800 >> auVar44;
  auVar20._0_4_ = local_478 + 0x800 >> auVar44;
  auVar20._12_4_ = iStack_46c + 0x800 >> auVar44;
  auVar20._8_4_ = iStack_470 + 0x800 >> auVar44;
  auVar19._4_4_ = iStack_494 + 0x800 >> auVar45;
  auVar19._0_4_ = local_498 + 0x800 >> auVar45;
  auVar19._12_4_ = iStack_48c + 0x800 >> auVar45;
  auVar19._8_4_ = iStack_490 + 0x800 >> auVar45;
  packssdw(auVar20,auVar19);
  local_8a8 = local_8c8[0];
  lStackY_8a0 = local_8c8[1];
  local_898 = local_8b8._0_8_;
  uStackY_890 = local_8b8._8_8_;
  __rounding_00[1] = auVar49._0_8_;
  __rounding_00[0] = (longlong)auVar48._8_8_;
  iadst16_stage8_ssse3(auVar48._8_8_,auVar48._0_8_,__rounding_00,auVar48[7]);
  iadst16_stage9_ssse3(in_RSI,&local_8c8);
  return;
}

Assistant:

static void iadst16_low1_ssse3(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p08_p56 = pair_set_epi16(cospi[8], cospi[56]);
  const __m128i cospi_p56_m08 = pair_set_epi16(cospi[56], -cospi[8]);
  const __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);
  const __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);

  // stage 1
  __m128i x[16];
  x[1] = input[0];

  // stage 2
  btf_16_ssse3(cospi[62], -cospi[2], x[1], x[0], x[1]);

  // stage 3
  x[8] = x[0];
  x[9] = x[1];

  // stage 4
  btf_16_sse2(cospi_p08_p56, cospi_p56_m08, x[8], x[9], x[8], x[9]);

  // stage 5
  x[4] = x[0];
  x[5] = x[1];
  x[12] = x[8];
  x[13] = x[9];

  // stage 6
  btf_16_sse2(cospi_p16_p48, cospi_p48_m16, x[4], x[5], x[4], x[5]);
  btf_16_sse2(cospi_p16_p48, cospi_p48_m16, x[12], x[13], x[12], x[13]);

  // stage 7
  x[2] = x[0];
  x[3] = x[1];
  x[6] = x[4];
  x[7] = x[5];
  x[10] = x[8];
  x[11] = x[9];
  x[14] = x[12];
  x[15] = x[13];

  iadst16_stage8_ssse3(x, cospi, __rounding, cos_bit);
  iadst16_stage9_ssse3(output, x);
}